

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_name_unittest.cc
# Opt level: O3

void __thiscall
bssl::ParseNameTest_RFC2253FormatInvalidOid_Test::TestBody
          (ParseNameTest_RFC2253FormatInvalidOid_Test *this)

{
  bool bVar1;
  pointer *__ptr;
  char *in_R9;
  pointer *__ptr_2;
  Input name_tlv;
  string output;
  RDNSequence rdn;
  uint8_t der [24];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b8;
  Message local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  AssertHelper local_a0;
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  string local_78;
  RDNSequence local_58;
  uchar local_38 [32];
  
  local_38[0] = '0';
  local_38[1] = '\x16';
  local_38[2] = '1';
  local_38[3] = '\x14';
  local_38[4] = '0';
  local_38[5] = '\x12';
  local_38[6] = '\x06';
  local_38[7] = '\n';
  local_38[8] = 0x81;
  local_38[9] = '\r';
  local_38[10] = '\x06';
  local_38[0xb] = '\x01';
  local_38[0xc] = 0x99;
  local_38[0xd] = '!';
  local_38[0xe] = '\x01';
  local_38[0xf] = 0x8b;
  local_38[0x10] = ':';
  local_38[0x11] = 0x80;
  local_38[0x12] = '\x13';
  local_38[0x13] = '\x04';
  local_38[0x14] = 't';
  local_38[0x15] = 'e';
  local_38[0x16] = 's';
  local_38[0x17] = 't';
  local_58.
  super__Vector_base<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  name_tlv.data_.size_ = 0x18;
  name_tlv.data_.data_ = local_38;
  local_98[0] = (internal)ParseName(name_tlv,&local_58);
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((bool)local_98[0]) {
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    bVar1 = ConvertToRFC2253(&local_58,&local_78);
    local_b0.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = (internal)!bVar1;
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)&local_b0,
                 (AssertionResult *)"ConvertToRFC2253(rdn, &output)","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_name_unittest.cc"
                 ,0x169,(char *)CONCAT71(local_98._1_7_,local_98[0]));
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1);
      }
      if (local_b8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_b8._M_head_impl + 8))();
      }
      if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a8,local_a8);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                               local_78.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    testing::Message::Message(&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(internal *)local_98,(AssertionResult *)"ParseName(rdn_input, &rdn)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_name_unittest.cc"
               ,0x167,local_78._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                               local_78.field_2._M_local_buf[0]) + 1);
    }
    if ((long *)CONCAT71(local_b0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_b0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_b0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_b0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
  }
  ::std::
  vector<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

TEST(ParseNameTest, RFC2253FormatInvalidOid) {
  // Same DER as RFC2253FormatLargeOid but with the last byte of the OID
  // replaced with 0x80, which ends the OID with a truncated multi-byte
  // component.
  const uint8_t der[] = {0x30, 0x16, 0x31, 0x14, 0x30, 0x12, 0x06, 0x0a,
                         0x81, 0x0d, 0x06, 0x01, 0x99, 0x21, 0x01, 0x8b,
                         0x3a, 0x80, 0x13, 0x04, 0x74, 0x65, 0x73, 0x74};
  der::Input rdn_input(der);
  RDNSequence rdn;
  ASSERT_TRUE(ParseName(rdn_input, &rdn));
  std::string output;
  EXPECT_FALSE(ConvertToRFC2253(rdn, &output));
}